

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# put_data.hpp
# Opt level: O1

void __thiscall libtorrent::dht::put_data_observer::~put_data_observer(put_data_observer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_traversal_observer).super_observer._vptr_observer =
       (_func_int **)&PTR__put_data_observer_004fa1e8;
  pcVar2 = (this->m_token)._M_dataplus._M_p;
  paVar1 = &(this->m_token).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  observer::~observer((observer *)this);
  operator_delete(this,0x78);
  return;
}

Assistant:

put_data_observer(
		std::shared_ptr<traversal_algorithm> algorithm
		, udp::endpoint const& ep, node_id const& id, std::string token)
		: traversal_observer(std::move(algorithm), ep, id)
		, m_token(std::move(token))
	{
	}